

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_cons_euler_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  double dVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_GLOB *pRVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  REF_DBL *pRVar11;
  size_t __size;
  REF_DBL *pRVar12;
  long lVar13;
  long lVar14;
  REF_DBL state [5];
  REF_DBL dflux_dcons [25];
  REF_STATUS local_198;
  REF_DBL *local_190;
  REF_DBL *local_188;
  double *local_178;
  REF_DBL local_148 [4];
  REF_DBL local_128;
  REF_DBL RStack_120;
  REF_DBL local_118;
  REF_DBL RStack_110;
  REF_DBL local_108;
  double local_f8 [25];
  
  pRVar3 = ref_grid->node;
  iVar2 = pRVar3->max;
  if ((long)iVar2 < 0) {
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xb8c,
           "ref_metric_cons_euler_g","malloc lam of REF_DBL negative");
    __size = 1;
  }
  else {
    __size = (long)iVar2 * 8;
    local_190 = (REF_DBL *)malloc(__size);
    if (local_190 == (REF_DBL *)0x0) {
      local_190 = (REF_DBL *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xb8c,"ref_metric_cons_euler_g","malloc lam of REF_DBL NULL");
      __size = 2;
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if (iVar2 != 0) {
        memset(local_190,0,__size);
      }
    }
  }
  local_198 = (REF_STATUS)__size;
  if (bVar5) {
    uVar6 = pRVar3->max;
    if ((int)uVar6 < 0) {
      bVar5 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xb8d,"ref_metric_cons_euler_g","malloc grad_lam of REF_DBL negative");
      local_198 = 1;
    }
    else {
      local_188 = (REF_DBL *)malloc((ulong)uVar6 * 0x18);
      if (local_188 == (REF_DBL *)0x0) {
        local_188 = (REF_DBL *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xb8d,"ref_metric_cons_euler_g","malloc grad_lam of REF_DBL NULL");
        local_198 = 2;
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if ((ulong)uVar6 != 0) {
          uVar10 = 1;
          if (1 < (int)(uVar6 * 3)) {
            uVar10 = (ulong)(uVar6 * 3);
          }
          memset(local_188,0,uVar10 << 3);
        }
      }
    }
    if (bVar5) {
      pRVar12 = prim_dual + ldim / 2;
      local_178 = local_f8;
      lVar8 = 0;
      do {
        iVar2 = pRVar3->max;
        if (0 < (long)iVar2) {
          pRVar4 = pRVar3->global;
          lVar14 = 0;
          pRVar11 = pRVar12;
          do {
            if (-1 < pRVar4[lVar14]) {
              local_190[lVar14] = *pRVar11;
            }
            lVar14 = lVar14 + 1;
            pRVar11 = pRVar11 + ldim;
          } while (iVar2 != lVar14);
        }
        uVar6 = ref_recon_gradient(ref_grid,local_190,local_188,reconstruction);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xb94,"ref_metric_cons_euler_g",(ulong)uVar6,"grad_lam");
          return uVar6;
        }
        lVar14 = 0;
        do {
          if (0 < pRVar3->max) {
            uVar10 = 0;
            lVar13 = 0;
            do {
              if (-1 < pRVar3->global[lVar13]) {
                lVar7 = (long)((int)lVar13 * ldim);
                local_148[0] = 0.0;
                local_148[1] = 0.0;
                local_148[2] = 0.0;
                local_148[lVar14] = 1.0;
                local_128 = prim_dual[lVar7];
                RStack_120 = (prim_dual + lVar7)[1];
                local_118 = prim_dual[lVar7 + 2];
                RStack_110 = (prim_dual + lVar7 + 2)[1];
                local_108 = prim_dual[lVar7 + 4];
                uVar6 = ref_phys_euler_jac(&local_128,local_148,local_f8);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xb9e,"ref_metric_cons_euler_g",(ulong)uVar6,"euler");
                  return uVar6;
                }
                dVar1 = local_188[lVar13 * 3 + lVar14];
                lVar7 = 0;
                pdVar9 = local_178;
                do {
                  g[uVar10 + lVar7] = *pdVar9 * dVar1 + g[uVar10 + lVar7];
                  lVar7 = lVar7 + 1;
                  pdVar9 = pdVar9 + 5;
                } while (lVar7 != 5);
              }
              lVar13 = lVar13 + 1;
              uVar10 = (ulong)((int)uVar10 + 5);
            } while (lVar13 < pRVar3->max);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        lVar8 = lVar8 + 1;
        pRVar12 = pRVar12 + 1;
        local_178 = local_178 + 1;
      } while (lVar8 != 5);
      if (local_188 != (REF_DBL *)0x0) {
        free(local_188);
      }
      if (local_190 != (REF_DBL *)0x0) {
        free(local_190);
      }
      local_198 = 0;
    }
  }
  return local_198;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_euler_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], dflux_dcons[25], direction[3];
  REF_DBL *lam, *grad_lam;
  REF_BOOL debug_export = REF_FALSE;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler_jac(state, direction, dflux_dcons), "euler");
        for (i = 0; i < 5; i++) {
          g[i + 5 * node] +=
              dflux_dcons[var + i * 5] * grad_lam[dir + 3 * node];
        }
      }
    }

    if (debug_export) {
      char filename[32];
      snprintf(filename, 32, "gradlam%d.tec", var);
      ref_gather_scalar_by_extension(ref_grid, 3, grad_lam, NULL, filename);
    }
  }
  ref_free(grad_lam);
  ref_free(lam);

  if (debug_export) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 5, g, NULL, "g.tec"),
        "dump g");
  }

  return REF_SUCCESS;
}